

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O1

uint32_t JenkinsOOAT_perl(char *key,int len,uint32_t hash)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  
  if (0 < len) {
    pbVar3 = (byte *)(key + len);
    do {
      bVar1 = *key;
      key = (char *)((byte *)key + 1);
      uVar2 = (bVar1 + hash) * 0x401;
      hash = uVar2 >> 6 ^ uVar2;
    } while (key < pbVar3);
  }
  return (hash * 9 >> 0xb ^ hash * 9) * 0x8001;
}

Assistant:

uint32_t JenkinsOOAT_perl(const char *key, int len, uint32_t hash)
{
  unsigned char  *str = (unsigned char *)key;
  const unsigned char *const end = (const unsigned char *)str + len;
  while (str < end) {
    hash += *str++;
    hash += (hash << 10);
    hash ^= (hash >> 6);
  }
  hash += (hash << 3);
  hash ^= (hash >> 11);
  hash = hash + (hash << 15);
  return hash;
}